

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

FrameIndex __thiscall iDynTree::Model::getFrameIndex(Model *this,string *frameName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  __type _Var3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ostream *poVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  stringstream ss;
  size_t i_1;
  size_t i;
  Model *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  ulong local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  FrameIndex local_8;
  
  local_20 = 0;
  local_18 = in_RSI;
  while( true ) {
    uVar2 = local_20;
    sVar4 = getNrOfLinks((Model *)0x44ae67);
    if (sVar4 <= uVar2) {
      local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 getNrOfLinks((Model *)0x44aee4);
      while( true ) {
        __lhs = local_28;
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 getNrOfFrames(in_stack_fffffffffffffde0);
        pbVar1 = local_28;
        if (pbVar5 <= __lhs) {
          std::__cxx11::stringstream::stringstream(local_1b0);
          poVar6 = std::operator<<(local_1a0,"Frame named ");
          poVar6 = std::operator<<(poVar6,(string *)local_18);
          std::operator<<(poVar6," not found in the model.");
          std::__cxx11::stringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("Model","getFrameIndex",pcVar7);
          std::__cxx11::string::~string(local_1e0);
          local_8 = FRAME_INVALID_INDEX;
          std::__cxx11::stringstream::~stringstream(local_1b0);
          return local_8;
        }
        pbVar5 = local_18;
        sVar4 = getNrOfLinks((Model *)0x44af46);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x98),(long)pbVar1 - sVar4);
        _Var3 = std::operator==(__lhs,pbVar5);
        if (_Var3) break;
        local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_28->field_0x1;
      }
      return (FrameIndex)local_28;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x68),local_20);
    _Var3 = std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (_Var3) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

FrameIndex Model::getFrameIndex(const std::string& frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return (FrameIndex)i;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return (FrameIndex)i;
        }
    }

    std::stringstream ss;
    ss << "Frame named " << frameName << " not found in the model.";
    reportError("Model","getFrameIndex",ss.str().c_str());
    return FRAME_INVALID_INDEX;
}